

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_light.cpp
# Opt level: O1

void * QuadLight_create(void)

{
  QuadLight *self;
  undefined4 *puVar1;
  undefined1 auVar2 [16];
  float fVar3;
  
  puVar1 = (undefined4 *)embree::alignedUSMMalloc(0x70,0x10,DEVICE_READ_ONLY);
  *puVar1 = 6;
  *(undefined8 *)(puVar1 + 4) = 0;
  *(undefined8 *)(puVar1 + 6) = 0;
  *(undefined8 *)(puVar1 + 8) = 0x3f80000000000000;
  *(undefined8 *)(puVar1 + 10) = 0;
  auVar2._0_12_ = ZEXT812(0x3f800000);
  auVar2._12_4_ = 0;
  *(undefined1 (*) [16])(puVar1 + 0xc) = auVar2;
  auVar2 = _DAT_00254e30;
  *(undefined1 (*) [16])(puVar1 + 0x10) = _DAT_00254e30;
  auVar2 = rcpss(auVar2,0x3f800000);
  fVar3 = (2.0 - auVar2._0_4_) * auVar2._0_4_;
  puVar1[0x18] = fVar3;
  puVar1[0x14] = fVar3 * 0.0;
  puVar1[0x15] = fVar3 * 0.0;
  puVar1[0x16] = fVar3 * 1.0;
  puVar1[0x17] = fVar3 * 0.0;
  return puVar1;
}

Assistant:

void* QuadLight_create()
{
  QuadLight* self = (QuadLight*) alignedUSMMalloc(sizeof(QuadLight),16);

  Light_Constructor(&self->super);
  //self->super.sample = GET_FUNCTION_POINTER(QuadLight_sample);
  self->super.type = LIGHT_QUAD;

  QuadLight_set(self,
                Vec3fa(0.f),
                Vec3fa(1.f, 0.f, 0.f),
                Vec3fa(0.f, 1.f, 0.f),
                Vec3fa(1.f));

  return self;
}